

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O1

endpoint_t * __thiscall
zmq::ctx_t::find_endpoint(endpoint_t *__return_storage_ptr__,ctx_t *this,char *addr_)

{
  iterator iVar1;
  int *piVar2;
  scoped_lock_t locker;
  allocator<char> local_49;
  scoped_lock_t local_48;
  key_type local_40;
  
  scoped_lock_t::scoped_lock_t(&local_48,&this->_endpoints_sync);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,addr_,&local_49);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>_>
          ::find(&(this->_endpoints)._M_t,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar1._M_node == &(this->_endpoints)._M_t._M_impl.super__Rb_tree_header) {
    piVar2 = __errno_location();
    *piVar2 = 0x6f;
    __return_storage_ptr__->socket = (socket_base_t *)0x0;
    options_t::options_t(&__return_storage_ptr__->options);
  }
  else {
    __return_storage_ptr__->socket = *(socket_base_t **)(iVar1._M_node + 2);
    options_t::options_t(&__return_storage_ptr__->options,(options_t *)&iVar1._M_node[2]._M_parent);
    own_t::inc_seqnum(&__return_storage_ptr__->socket->super_own_t);
  }
  scoped_lock_t::~scoped_lock_t(&local_48);
  return __return_storage_ptr__;
}

Assistant:

zmq::endpoint_t zmq::ctx_t::find_endpoint (const char *addr_)
{
    scoped_lock_t locker (_endpoints_sync);

    endpoints_t::iterator it = _endpoints.find (addr_);
    if (it == _endpoints.end ()) {
        errno = ECONNREFUSED;
        endpoint_t empty = {NULL, options_t ()};
        return empty;
    }
    endpoint_t endpoint = it->second;

    //  Increment the command sequence number of the peer so that it won't
    //  get deallocated until "bind" command is issued by the caller.
    //  The subsequent 'bind' has to be called with inc_seqnum parameter
    //  set to false, so that the seqnum isn't incremented twice.
    endpoint.socket->inc_seqnum ();

    return endpoint;
}